

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglshaderprogram.cpp
# Opt level: O3

bool __thiscall QOpenGLShaderProgram::addShader(QOpenGLShaderProgram *this,QOpenGLShader *shader)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  long in_FS_OFFSET;
  QObject aQStack_38 [8];
  QOpenGLShader *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = *(long *)&this->field_0x8;
  iVar5 = init(this,(EVP_PKEY_CTX *)shader);
  if ((char)iVar5 != '\0') {
    if (*(long *)(lVar3 + 0xb0) != 0) {
      lVar6 = 0;
      do {
        if (*(long *)(lVar3 + 0xb0) << 3 == lVar6) goto LAB_0014c386;
        lVar1 = lVar6 + 8;
        plVar2 = (long *)(*(long *)(lVar3 + 0xa8) + lVar6);
        lVar6 = lVar1;
      } while ((QOpenGLShader *)*plVar2 != shader);
      bVar4 = true;
      if (lVar1 != 0) goto LAB_0014c443;
    }
LAB_0014c386:
    lVar6 = *(long *)(lVar3 + 0x78);
    if (lVar6 != 0) {
      bVar4 = false;
      if ((shader == (QOpenGLShader *)0x0) || (bVar4 = false, *(int *)(lVar6 + 0x10) == 0))
      goto LAB_0014c443;
      lVar1 = *(long *)(*(long *)&shader->field_0x8 + 0x78);
      if ((lVar1 != 0) && (*(int *)(lVar1 + 0x10) != 0)) {
        if (*(long *)(lVar6 + 8) == *(long *)(lVar1 + 8)) {
          (**(code **)(**(long **)(lVar3 + 0xd0) + 0x180))();
          *(undefined1 *)(lVar3 + 0x80) = 0;
          local_30 = shader;
          QtPrivate::QPodArrayOps<QOpenGLShader*>::emplace<QOpenGLShader*&>
                    ((QPodArrayOps<QOpenGLShader*> *)(lVar3 + 0xa0),*(qsizetype *)(lVar3 + 0xb0),
                     &local_30);
          QList<QOpenGLShader_*>::end((QList<QOpenGLShader_*> *)(lVar3 + 0xa0));
          QObject::connect(aQStack_38,(char *)shader,(QObject *)"2destroyed()",(char *)this,0x17f392
                          );
          QMetaObject::Connection::~Connection((Connection *)aQStack_38);
          bVar4 = true;
          goto LAB_0014c443;
        }
        addShader();
      }
    }
  }
  bVar4 = false;
LAB_0014c443:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QOpenGLShaderProgram::addShader(QOpenGLShader *shader)
{
    Q_D(QOpenGLShaderProgram);
    if (!init())
        return false;
    if (d->shaders.contains(shader))
        return true;    // Already added to this shader program.
    if (d->programGuard && d->programGuard->id() && shader) {
        if (!shader->d_func()->shaderGuard || !shader->d_func()->shaderGuard->id())
            return false;
        if (d->programGuard->group() != shader->d_func()->shaderGuard->group()) {
            qWarning("QOpenGLShaderProgram::addShader: Program and shader are not associated with same context.");
            return false;
        }
        d->glfuncs->glAttachShader(d->programGuard->id(), shader->d_func()->shaderGuard->id());
        d->linked = false;  // Program needs to be relinked.
        d->shaders.append(shader);
        connect(shader, SIGNAL(destroyed()), this, SLOT(shaderDestroyed()));
        return true;
    } else {
        return false;
    }
}